

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O1

void __thiscall
LinkParser::parseEnergy
          (LinkParser *this,Link *link,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  InputError *pIVar5;
  Pattern *pPVar6;
  Curve *pCVar7;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string keyword;
  
  iVar4 = (*(link->super_Element)._vptr_Element[2])(link);
  if (iVar4 == 1) {
    pbVar1 = (tokenList->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(tokenList->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x80) {
      pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
      InputError::InputError(pIVar5,2,&local_110);
      __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
    }
    local_70 = (undefined1  [8])&keyword._M_string_length;
    pcVar2 = pbVar1[2]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
    keyword.field_2._8_8_ = &stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&keyword.field_2 + 8),"PRICE","");
    bVar3 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
    if ((undefined1 *)keyword.field_2._8_8_ != &stack0xffffffffffffffc0) {
      operator_delete((void *)keyword.field_2._8_8_);
    }
    if (bVar3) {
      bVar3 = Utilities::parseNumber<double>
                        (pbVar1 + 3,(double *)&link[2].super_Element.name._M_string_length);
      if (!bVar3) {
        pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        pcVar2 = pbVar1[3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
        InputError::InputError(pIVar5,6,&local_f0);
        __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
    else {
      keyword.field_2._8_8_ = &stack0xffffffffffffffc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&keyword.field_2 + 8),"PATTERN","");
      bVar3 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
      if ((undefined1 *)keyword.field_2._8_8_ != &stack0xffffffffffffffc0) {
        operator_delete((void *)keyword.field_2._8_8_);
      }
      if (bVar3) {
        pPVar6 = Network::pattern(network,pbVar1 + 3);
        link[2].super_Element.name._M_dataplus._M_p = (pointer)pPVar6;
        if (pPVar6 == (Pattern *)0x0) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar2 = pbVar1[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
          InputError::InputError(pIVar5,5,&local_d0);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
      else {
        keyword.field_2._8_8_ = &stack0xffffffffffffffc0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&keyword.field_2 + 8),"EFFIC","");
        bVar3 = Utilities::match((string *)local_70,(string *)((long)&keyword.field_2 + 8));
        if ((undefined1 *)keyword.field_2._8_8_ != &stack0xffffffffffffffc0) {
          operator_delete((void *)keyword.field_2._8_8_);
        }
        if (!bVar3) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_70,keyword._M_dataplus._M_p + (long)local_70);
          InputError::InputError(pIVar5,3,&local_90);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
        pCVar7 = Network::curve(network,pbVar1 + 3);
        link[2].super_Element._vptr_Element = (_func_int **)pCVar7;
        if (pCVar7 == (Curve *)0x0) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          pcVar2 = pbVar1[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
          InputError::InputError(pIVar5,5,&local_b0);
          __cxa_throw(pIVar5,&InputError::typeinfo,ENerror::~ENerror);
        }
      }
    }
    if (local_70 != (undefined1  [8])&keyword._M_string_length) {
      operator_delete((void *)local_70);
    }
  }
  return;
}

Assistant:

void LinkParser::parseEnergy(
        Link* link, Network* network, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - PUMP keyword
    // 1 - pump ID
    // 2 - PRICE/PATTERN/EFFIC keyword
    // 3 - price value or ID of pattern or efficiency curve

    // ... cast link to a pump

    if ( link->type() != Link::PUMP ) return;
    Pump* pump = static_cast<Pump*>(link);

    // ... read keyword from input stream

    if ( tokenList.size() < 4) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];
    string keyword = tokens[2];

    // ... read energy cost per Kwh

    if ( Utilities::match(keyword, w_Price) )
    {
        if ( !Utilities::parseNumber(tokens[3], pump->costPerKwh) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[3]);
        }
    }

    // ... read name of energy cost time pattern

    else if ( Utilities::match(keyword, w_Pattern) )
    {
        pump->costPattern = network->pattern(tokens[3]);
        if ( !pump->costPattern )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
        }
    }

    // ... read name of pump efficiency curve

    else if ( Utilities::match(keyword, w_Effic) )
    {
        pump->efficCurve = network->curve(tokens[3]);
        if ( !pump->efficCurve )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
        }
    }

    else throw InputError(InputError::INVALID_KEYWORD, keyword);
}